

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::egl::anon_unknown_1::LoseContextOnResetCase::iterate(LoseContextOnResetCase *this)

{
  glActiveTextureFunc *this_00;
  ostringstream *poVar1;
  TestLog *pTVar2;
  GLenum err;
  deUint32 err_00;
  char *description;
  bool bVar3;
  GLint reset;
  RenderingContext context;
  Enum<int,_2UL> local_1c08;
  EGLint attribList [9];
  undefined1 local_1bc8 [384];
  Functions gl;
  
  pTVar2 = ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
  this_00 = &gl.activeTexture;
  gl.activeShaderProgram = (glActiveShaderProgramFunc)pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,
                  "Check the reset notification strategy returned by glGetIntegerv() equals GL_LOSE_CONTEXT_ON_RESET\n\n"
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&gl,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  attribList[4] = 0x30bf;
  attribList[5] = 1;
  attribList[6] = 0x3138;
  attribList[7] = 0x31bf;
  attribList[0] = 0x3098;
  attribList[1] = 3;
  attribList[2] = 0x30fb;
  attribList[3] = 1;
  attribList[8] = 0x3038;
  RobustnessTestCase::checkRequiredEGLExtensions(&this->super_RobustnessTestCase,attribList);
  gl.activeShaderProgram = (glActiveShaderProgramFunc)0x0;
  RenderingContext::RenderingContext
            (&context,(this->super_RobustnessTestCase).super_TestCase.m_eglTestCtx,attribList,
             &(this->super_RobustnessTestCase).m_eglConfig,
             &(this->super_RobustnessTestCase).m_eglDisplay,&gl.activeShaderProgram);
  RenderingContext::makeCurrent(&context,&(this->super_RobustnessTestCase).m_eglSurface);
  glw::Functions::Functions(&gl);
  RenderingContext::initGLFunctions(&context,&gl);
  checkRequiredGLRobustnessExtension(attribList,&gl);
  reset = 0;
  (*gl.getIntegerv)(0x8256,&reset);
  err = (*gl.getError)();
  glu::checkError(err,"glGetIntegerv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x5f6);
  bVar3 = reset != 0x8252;
  local_1bc8._0_8_ = pTVar2;
  if (bVar3) {
    poVar1 = (ostringstream *)(local_1bc8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Test failed! glGetIntegerv() returned wrong value. [");
    std::ostream::operator<<(poVar1,reset);
    std::operator<<((ostream *)poVar1,", expected ");
    local_1c08.m_getName = glu::getErrorName;
    local_1c08.m_value = 0x8252;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c08,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1,"]");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1bc8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    description = "Fail";
  }
  else {
    poVar1 = (ostringstream *)(local_1bc8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Check the graphics reset status returned by glGetGraphicsResetStatus() ");
    std::operator<<((ostream *)poVar1,"equals GL_NO_ERROR\n");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1bc8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (*gl.getGraphicsResetStatus)();
    err_00 = (*gl.getError)();
    glu::checkError(err_00,"getGraphicsResetStatus()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x607);
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_RobustnessTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
             ,(uint)bVar3,description);
  RenderingContext::~RenderingContext(&context);
  return STOP;
}

Assistant:

TestCase::IterateResult	iterate		(void)
	{
		TestLog&	log		= m_testCtx.getLog();

		log << tcu::TestLog::Message
			<< "Check the reset notification strategy returned by glGetIntegerv() equals GL_LOSE_CONTEXT_ON_RESET\n\n"
			<< tcu::TestLog::EndMessage;

		const EGLint attribList[] =
		{
			EGL_CONTEXT_CLIENT_VERSION, 3,
			EGL_CONTEXT_MINOR_VERSION_KHR, 1,
			EGL_CONTEXT_OPENGL_ROBUST_ACCESS_EXT, EGL_TRUE,
			EGL_CONTEXT_OPENGL_RESET_NOTIFICATION_STRATEGY_EXT, EGL_LOSE_CONTEXT_ON_RESET,
			EGL_NONE
		};

		checkRequiredEGLExtensions(attribList);

		RenderingContext context(m_eglTestCtx, attribList, m_eglConfig, m_eglDisplay, EGL_NO_CONTEXT);
		context.makeCurrent(m_eglSurface);

		glw::Functions gl;
		context.initGLFunctions(&gl);
		checkRequiredGLRobustnessExtension(attribList, gl);

		glw::GLint reset = 0;
		gl.getIntegerv(GL_RESET_NOTIFICATION_STRATEGY, &reset);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv()");

		if (reset != GL_LOSE_CONTEXT_ON_RESET)
		{
			log	<< tcu::TestLog::Message
				<< "Test failed! glGetIntegerv() returned wrong value. [" << reset << ", expected " << glu::getErrorStr(GL_LOSE_CONTEXT_ON_RESET) << "]"
				<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}

		log << tcu::TestLog::Message
			<< "Check the graphics reset status returned by glGetGraphicsResetStatus() "
			<< "equals GL_NO_ERROR\n"
			<< tcu::TestLog::EndMessage;

		GLU_CHECK_GLW_CALL(gl, getGraphicsResetStatus());

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}